

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndTabItem(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *pIVar2;
  int iVar3;
  short sVar4;
  
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    pIVar2 = GImGui->CurrentTabBar;
    if (pIVar2 == (ImGuiTabBar *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc2,"EndTabItem","ImGui ASSERT FAILED: %s",
                  "tab_bar != NULL && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                 );
      return;
    }
    sVar4 = pIVar2->LastTabItemIdx;
    if (sVar4 < 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc5,"EndTabItem","ImGui ASSERT FAILED: %s","tab_bar->LastTabItemIdx >= 0");
      sVar4 = pIVar2->LastTabItemIdx;
    }
    if ((pIVar2->Tabs).Size <= (int)sVar4) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    if (((pIVar2->Tabs).Data[sVar4].Flags & 8) == 0) {
      iVar3 = (pIVar1->IDStack).Size;
      if (iVar3 < 1) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x61a,"pop_back","ImGui ASSERT FAILED: %s","Size > 0");
        iVar3 = (pIVar1->IDStack).Size;
      }
      (pIVar1->IDStack).Size = iVar3 + -1;
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar != NULL && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        window->IDStack.pop_back();
}